

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

_Bool memory_region_access_valid_ppc64
                (uc_struct_conflict11 *uc,MemoryRegion *mr,hwaddr addr,uint size,_Bool is_write,
                MemTxAttrs attrs)

{
  uint uVar1;
  _func__Bool_uc_struct_ptr_void_ptr_hwaddr_uint__Bool_MemTxAttrs_conflict15 *p_Var2;
  _Bool _Var3;
  MemoryRegionOps *pMVar4;
  MemTxAttrs unaff_EBX;
  
  pMVar4 = mr->ops;
  p_Var2 = (pMVar4->valid).accepts;
  if (p_Var2 != (_func__Bool_uc_struct_ptr_void_ptr_hwaddr_uint__Bool_MemTxAttrs_conflict15 *)0x0) {
    _Var3 = (*p_Var2)((uc_struct_conflict15 *)uc,mr->opaque,addr,size,is_write,unaff_EBX);
    if (!_Var3) {
      return false;
    }
    pMVar4 = mr->ops;
  }
  if (((pMVar4->valid).unaligned != false) || ((size - 1 & (uint)addr) == 0)) {
    uVar1 = (pMVar4->valid).max_access_size;
    if (uVar1 == 0) {
      return true;
    }
    if (size <= uVar1) {
      return (pMVar4->valid).min_access_size <= size;
    }
  }
  return false;
}

Assistant:

bool memory_region_access_valid(struct uc_struct *uc, MemoryRegion *mr,
                                hwaddr addr,
                                unsigned size,
                                bool is_write,
                                MemTxAttrs attrs)
{
    if (mr->ops->valid.accepts
        && !mr->ops->valid.accepts(uc, mr->opaque, addr, size, is_write, attrs)) {
        return false;
    }

    if (!mr->ops->valid.unaligned && (addr & (size - 1))) {
        return false;
    }

    /* Treat zero as compatibility all valid */
    if (!mr->ops->valid.max_access_size) {
        return true;
    }

    if (size > mr->ops->valid.max_access_size
        || size < mr->ops->valid.min_access_size) {
        return false;
    }
    return true;
}